

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

bool __thiscall
glcts::TestCaseBase::buildProgramVA
          (TestCaseBase *this,GLuint po_id,bool *out_has_compilation_failed,uint sh_stages,...)

{
  code *pcVar1;
  char in_AL;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  reference puVar9;
  GLenum shader_type_00;
  GLenum shader_type_01;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_708;
  uint *local_6f0;
  GLuint *local_6d8;
  undefined1 local_6b8 [32];
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_678;
  undefined8 local_668;
  undefined8 local_658;
  undefined8 local_648;
  undefined8 local_638;
  undefined8 local_628;
  undefined8 local_618;
  MessageBuilder local_600;
  undefined1 local_480 [8];
  string shader_source;
  string shader_type_str_1;
  iterator iStack_438;
  GLint shader_type_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_430;
  iterator it;
  undefined1 local_2a8 [8];
  string link_log;
  GLint link_status;
  undefined1 local_100 [8];
  string shader_type_str;
  string info_log;
  undefined8 uStack_b8;
  GLint shader_type;
  char *sh_merged_ptr;
  undefined1 local_a0 [8];
  string sh_merged_string;
  char **sh_code;
  uint sh_parts;
  GLuint sh_id;
  uint stage;
  GLint compilation_status;
  va_list values;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec_sh_id;
  Functions *gl;
  uint sh_stages_local;
  bool *out_has_compilation_failed_local;
  GLuint po_id_local;
  TestCaseBase *this_local;
  long lVar6;
  
  if (in_AL != '\0') {
    local_688 = in_XMM0_Qa;
    local_678 = in_XMM1_Qa;
    local_668 = in_XMM2_Qa;
    local_658 = in_XMM3_Qa;
    local_648 = in_XMM4_Qa;
    local_638 = in_XMM5_Qa;
    local_628 = in_XMM6_Qa;
    local_618 = in_XMM7_Qa;
  }
  local_698 = in_R8;
  local_690 = in_R9;
  pRVar5 = deqp::Context::getRenderContext(this->m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&values[0].reg_save_area);
  values[0].overflow_arg_area = local_6b8;
  values[0]._0_8_ = &stack0x00000008;
  compilation_status = 0x30;
  stage = 0x20;
  sh_id = 0;
  for (sh_parts = 0; sh_parts < sh_stages; sh_parts = sh_parts + 1) {
    if (stage < 0x29) {
      local_6d8 = (GLuint *)((long)(int)stage + (long)values[0].overflow_arg_area);
      stage = stage + 8;
    }
    else {
      local_6d8 = (GLuint *)values[0]._0_8_;
      values[0]._0_8_ = values[0]._0_8_ + 8;
    }
    sh_code._4_4_ = *local_6d8;
    if (stage < 0x29) {
      local_6f0 = (uint *)((long)(int)stage + (long)values[0].overflow_arg_area);
      stage = stage + 8;
    }
    else {
      local_6f0 = (uint *)values[0]._0_8_;
      values[0]._0_8_ = values[0]._0_8_ + 8;
    }
    sh_code._0_4_ = *local_6f0;
    if (stage < 0x29) {
      local_708 = (undefined8 *)((long)(int)stage + (long)values[0].overflow_arg_area);
      stage = stage + 8;
    }
    else {
      local_708 = (undefined8 *)values[0]._0_8_;
      values[0]._0_8_ = values[0]._0_8_ + 8;
    }
    sh_merged_string.field_2._8_8_ = *local_708;
    if (sh_code._4_4_ != 0) {
      if ((uint)sh_code != 0) {
        specializeShader_abi_cxx11_
                  ((string *)local_a0,this,(uint)sh_code,(char **)sh_merged_string.field_2._8_8_);
        uStack_b8 = std::__cxx11::string::c_str();
        (**(code **)(lVar6 + 0x12b8))(sh_code._4_4_,1,&stack0xffffffffffffff48,0);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glShaderSource() failed!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                        ,0x19b);
        (**(code **)(lVar6 + 0x248))(sh_code._4_4_);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glCompileShader() failed!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                        ,0x19e);
        (**(code **)(lVar6 + 0xa70))(sh_code._4_4_,0x8b81,&sh_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glGetShaderiv() failed!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                        ,0x1a1);
        if (sh_id == 1) {
          link_log.field_2._12_4_ = 0;
        }
        else {
          info_log.field_2._12_4_ = 0;
          getCompilationInfoLog_abi_cxx11_
                    ((string *)((long)&shader_type_str.field_2 + 8),this,sh_code._4_4_);
          (**(code **)(lVar6 + 0xa70))
                    (sh_code._4_4_,0x8b4f,(undefined1 *)((long)&info_log.field_2 + 0xc));
          getShaderTypeName_abi_cxx11_
                    ((string *)local_100,(glcts *)(ulong)(uint)info_log.field_2._12_4_,
                     shader_type_00);
          pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&link_status,pTVar7,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&link_status,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_100);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [24])0x2b26609);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&shader_type_str.field_2 + 8));
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a83ded);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_100);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [11])0x2adb68e);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a0);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a83ded);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&link_status);
          link_log.field_2._12_4_ = 2;
          std::__cxx11::string::~string((string *)local_100);
          std::__cxx11::string::~string((string *)(shader_type_str.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string((string *)local_a0);
        if (link_log.field_2._12_4_ != 0) break;
      }
      (**(code **)(lVar6 + 0x10))(po_id,sh_code._4_4_);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glAttachShader(VERTEX_SHADER) call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                      ,0x1b6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&values[0].reg_save_area,
                 (value_type_conflict4 *)((long)&sh_code + 4));
    }
  }
  if (out_has_compilation_failed != (bool *)0x0) {
    *out_has_compilation_failed = sh_id == 0;
  }
  if (sh_id == 1) {
    link_log.field_2._8_4_ = 0;
    (**(code **)(lVar6 + 0xce8))(po_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glLinkProgram() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                    ,0x1cb);
    (**(code **)(lVar6 + 0x9d8))(po_id,0x8b82,(undefined1 *)((long)&link_log.field_2 + 8));
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGetProgramiv() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                    ,0x1ce);
    if (link_log.field_2._8_4_ == 1) {
      this_local._7_1_ = true;
      link_log.field_2._12_4_ = 1;
    }
    else {
      getLinkingInfoLog_abi_cxx11_((string *)local_2a8,this,po_id);
      pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&it,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&it,(char (*) [16])"Link failure:\n\n");
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2a8);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a83ded);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&it);
      local_430._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &values[0].reg_save_area);
      while( true ) {
        iStack_438 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &values[0].reg_save_area);
        bVar2 = __gnu_cxx::operator!=(&local_430,&stack0xfffffffffffffbc8);
        if (!bVar2) break;
        shader_type_str_1.field_2._12_4_ = 0;
        pcVar1 = *(code **)(lVar6 + 0xa70);
        puVar9 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_430);
        (*pcVar1)(*puVar9,0x8b4f,(undefined1 *)((long)&shader_type_str_1.field_2 + 0xc));
        getShaderTypeName_abi_cxx11_
                  ((string *)((long)&shader_source.field_2 + 8),
                   (glcts *)(ulong)(uint)shader_type_str_1.field_2._12_4_,shader_type_01);
        puVar9 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_430);
        getShaderSource_abi_cxx11_((string *)local_480,this,*puVar9);
        pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_600,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_600,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&shader_source.field_2 + 8));
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [11])0x2adb68e);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_480);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a83ded);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_600);
        std::__cxx11::string::~string((string *)local_480);
        std::__cxx11::string::~string((string *)(shader_source.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_430);
      }
      this_local._7_1_ = false;
      link_log.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_2a8);
    }
  }
  else {
    this_local._7_1_ = false;
    link_log.field_2._12_4_ = 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&values[0].reg_save_area);
  return this_local._7_1_;
}

Assistant:

bool TestCaseBase::buildProgramVA(glw::GLuint po_id, bool* out_has_compilation_failed, unsigned int sh_stages, ...)
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	std::vector<glw::GLuint> vec_sh_id;

	va_list values;
	va_start(values, sh_stages);

	/* Shaders compilation */
	glw::GLint compilation_status = GL_FALSE;

	for (unsigned int stage = 0; stage < sh_stages; ++stage)
	{
		glw::GLuint		   sh_id	= va_arg(values, glw::GLuint);
		unsigned int	   sh_parts = va_arg(values, unsigned int);
		const char* const* sh_code  = va_arg(values, const char* const*);

		if (sh_id == 0)
		{
			continue;
		}

		if (sh_parts != 0)
		{
			std::string sh_merged_string = specializeShader(sh_parts, sh_code);
			const char* sh_merged_ptr	= sh_merged_string.c_str();

			gl.shaderSource(sh_id, 1, &sh_merged_ptr, NULL);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed!");

			gl.compileShader(sh_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed!");

			gl.getShaderiv(sh_id, GL_COMPILE_STATUS, &compilation_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed!");

			if (compilation_status != GL_TRUE)
			{
				glw::GLint  shader_type = 0;
				std::string info_log	= getCompilationInfoLog(sh_id);

				gl.getShaderiv(sh_id, GL_SHADER_TYPE, &shader_type);
				std::string shader_type_str = getShaderTypeName(shader_type);

				m_testCtx.getLog() << tcu::TestLog::Message << shader_type_str << " compilation failure:\n\n"
								   << info_log << "\n\n"
								   << shader_type_str << " source:\n\n"
								   << sh_merged_string << "\n\n"
								   << tcu::TestLog::EndMessage;

				break;
			}
		}

		gl.attachShader(po_id, sh_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader(VERTEX_SHADER) call failed");

		vec_sh_id.push_back(sh_id);
	}

	va_end(values);

	if (out_has_compilation_failed != NULL)
	{
		*out_has_compilation_failed = (compilation_status == GL_FALSE);
	}

	if (compilation_status != GL_TRUE)
	{
		return false;
	}

	/* Linking the program */

	glw::GLint link_status = GL_FALSE;
	gl.linkProgram(po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed!");

	gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed!");

	if (link_status != GL_TRUE)
	{
		/* Dump link log */
		std::string link_log = getLinkingInfoLog(po_id);
		m_testCtx.getLog() << tcu::TestLog::Message << "Link failure:\n\n"
						   << link_log << "\n\n"
						   << tcu::TestLog::EndMessage;

		/* Dump shader source */
		for (std::vector<glw::GLuint>::iterator it = vec_sh_id.begin(); it != vec_sh_id.end(); ++it)
		{
			glw::GLint shader_type = 0;
			gl.getShaderiv(*it, GL_SHADER_TYPE, &shader_type);
			std::string shader_type_str = getShaderTypeName(shader_type);
			std::string shader_source   = getShaderSource(*it);
			m_testCtx.getLog() << tcu::TestLog::Message << shader_type_str << " source:\n\n"
							   << shader_source << "\n\n"
							   << tcu::TestLog::EndMessage;
		}

		return false;
	}

	return true;
}